

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O1

uint auth_method_from_name(char *name)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(name,"none");
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    iVar1 = strcmp(name,"tis");
    if (iVar1 == 0) {
      uVar2 = 0x10;
    }
    else {
      iVar1 = strcmp(name,"cryptocard");
      uVar2 = 0x20;
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"ccard");
        if (iVar1 != 0) {
          iVar1 = strcmp(name,"keyboard-interactive");
          uVar2 = 8;
          if (iVar1 != 0) {
            iVar1 = strcmp(name,"k-i");
            if (iVar1 != 0) {
              iVar1 = strcmp(name,"kbdint");
              if (iVar1 != 0) {
                iVar1 = strcmp(name,"ki");
                if (iVar1 != 0) {
                  iVar1 = strcmp(name,"publickey");
                  uVar2 = 4;
                  if (iVar1 != 0) {
                    iVar1 = strcmp(name,"pubkey");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(name,"pk");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(name,"password");
                        if (iVar1 == 0) {
                          uVar2 = 2;
                        }
                        else {
                          iVar1 = strcmp(name,"pw");
                          uVar2 = (uint)(iVar1 == 0) * 2;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static unsigned auth_method_from_name(const char *name)
{
    if (!strcmp(name, "none"))
        return AUTHMETHOD_NONE;
    if (!strcmp(name, "tis"))
        return AUTHMETHOD_TIS;
    if (!strcmp(name, "cryptocard") || !strcmp(name, "ccard"))
        return AUTHMETHOD_CRYPTOCARD;
    if (!strcmp(name, "keyboard-interactive") || !strcmp(name, "k-i") ||
        !strcmp(name, "kbdint")  || !strcmp(name, "ki"))
        return AUTHMETHOD_KBDINT;
    if (!strcmp(name, "publickey") || !strcmp(name, "pubkey") ||
        !strcmp(name, "pk"))
        return AUTHMETHOD_PUBLICKEY;
    if (!strcmp(name, "password") || !strcmp(name, "pw"))
        return AUTHMETHOD_PASSWORD;
    return 0;
}